

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall
clipp::detail::scoped_dfs_traverser::repeat_group_continues(scoped_dfs_traverser *this)

{
  bool bVar1;
  group *pgVar2;
  group *pgVar3;
  group *curRepGroup;
  scoped_dfs_traverser *this_local;
  
  if ((this->repeatGroupContinues_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    pgVar2 = group::depth_first_traverser::innermost_repeat_group(&this->pos_);
    if (pgVar2 == (group *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pgVar3 = group::depth_first_traverser::innermost_repeat_group(&this->lastMatch_);
      if (pgVar2 == pgVar3) {
        bVar1 = group::depth_first_traverser::operator_cast_to_bool(&this->posAfterLastMatch_);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool repeat_group_continues() const
    {
        if(!repeatGroupContinues_) return false;
        const auto curRepGroup = pos_.innermost_repeat_group();
        if(!curRepGroup) return false;
        if(curRepGroup != lastMatch_.innermost_repeat_group()) return false;
        if(!posAfterLastMatch_) return false;
        return true;
    }